

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O2

StringW * helper::to_wide(StringW *__return_storage_ptr__,String8 *str)

{
  range_error error;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&converter);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&converter,str);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&converter);
  return __return_storage_ptr__;
}

Assistant:

StringW to_wide( const String8 &str )
	{
		std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
		try
		{
			return converter.from_bytes( str );
		}
		catch( std::range_error error )
		{
			log( "Conversation failure 'to_wide(const String8 &)'. Message: " + String8( error.what() ), LogLevel::Warning );
			return L"";
		}
	}